

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::RegisterPendingWriteBarrierBlock(Recycler *this,void *address,size_t bytes)

{
  size_t local_20;
  size_t bytes_local;
  void *address_local;
  Recycler *this_local;
  
  if ((Js::Configuration::Global[0x2c156] & 1) != 0) {
    local_20 = bytes;
    bytes_local = (size_t)address;
    address_local = this;
    WBSetBitRange((char *)address,(uint)((bytes & 0xffffffff) >> 3));
    JsUtil::
    BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
    ::Item(&this->pendingWriteBarrierBlockMap,(void **)&bytes_local,&local_20);
    RecyclerWriteBarrierManager::WriteBarrier((void *)bytes_local,local_20);
  }
  return;
}

Assistant:

void
Recycler::RegisterPendingWriteBarrierBlock(void* address, size_t bytes)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
#if DBG
        WBSetBitRange((char*)address, (uint)bytes/sizeof(void*));
#endif
        pendingWriteBarrierBlockMap.Item(address, bytes);
        RecyclerWriteBarrierManager::WriteBarrier(address, bytes);
    }
}